

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listtype.c
# Opt level: O3

LuciObject * list_get_object(LuciObject *list,long index)

{
  int iVar1;
  ulong uVar2;
  LuciObject *pLVar3;
  uint uVar4;
  int iVar5;
  
  iVar5 = (int)index;
  if ((list == (LuciObject *)0x0) || (list->type != &obj_list_t)) {
    list_get_object_cold_2();
  }
  else {
    iVar1 = -iVar5;
    if (iVar5 < 1) {
      iVar1 = iVar5;
    }
    uVar2 = (ulong)(iVar1 + *(uint *)&list[1].field_0x8);
    if (-1 < index) {
      uVar2 = index;
    }
    if (uVar2 < *(uint *)&list[1].field_0x8) {
      pLVar3 = (LuciObject *)(**(code **)(*(long *)(&(list[1].type)->type_name)[uVar2] + 0x10))();
      return pLVar3;
    }
  }
  list_get_object_cold_1();
  if (*(int *)&list[1].field_0x8 != 0) {
    uVar4 = *(int *)&list[1].field_0x8 - 1;
    *(uint *)&list[1].field_0x8 = uVar4;
    pLVar3 = (LuciObject *)(&(list[1].type)->type_name)[uVar4];
    (&(list[1].type)->type_name)[uVar4] = (char *)0x0;
    return pLVar3;
  }
  LuciList_pop_cold_1();
  return (LuciObject *)(&(list[1].type)->type_name)[*(int *)&list[1].field_0x8 - 1];
}

Assistant:

static LuciObject *list_get_object(LuciObject *list, long index)
{
    if (!list || (!ISTYPE(list, obj_list_t))) {
	LUCI_DIE("%s", "Can't iterate over non-list object\n");
    }

    LuciListObj *listobj = (LuciListObj *)list;

    /* convert negative indices to a index starting from list end */
    while (index < 0) {
	index = listobj->count - abs(index);
    }

    if (index >= listobj->count) {
	LUCI_DIE("%s", "List index out of bounds\n");
    }
    LuciObject *item = listobj->items[index];
    return item->type->copy(item);
}